

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

TX_SIZE tx_size_from_tx_mode(BLOCK_SIZE bsize,TX_MODE tx_mode)

{
  TX_SIZE max_rect_tx_size;
  TX_SIZE largest_tx_size;
  TX_MODE tx_mode_local;
  BLOCK_SIZE bsize_local;
  byte local_1;
  
  local_1 = ""[tx_mode];
  if (bsize == BLOCK_4X4) {
    if (local_1 != '\0') {
      local_1 = '\0';
    }
  }
  else if (""[""[bsize]] <= local_1) {
    local_1 = ""[bsize];
  }
  return local_1;
}

Assistant:

static inline TX_SIZE tx_size_from_tx_mode(BLOCK_SIZE bsize, TX_MODE tx_mode) {
  const TX_SIZE largest_tx_size = tx_mode_to_biggest_tx_size[tx_mode];
  const TX_SIZE max_rect_tx_size = max_txsize_rect_lookup[bsize];
  if (bsize == BLOCK_4X4)
    return AOMMIN(max_txsize_lookup[bsize], largest_tx_size);
  if (txsize_sqr_map[max_rect_tx_size] <= largest_tx_size)
    return max_rect_tx_size;
  else
    return largest_tx_size;
}